

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

void randomx_calculate_hash_last(randomx_vm *machine,void *output)

{
  undefined8 in_RSI;
  randomx_vm *in_RDI;
  int chain;
  size_t in_stack_000000c8;
  void *in_stack_000000d0;
  size_t in_stack_000000d8;
  void *in_stack_000000e0;
  size_t in_stack_000000e8;
  void *in_stack_000000f0;
  int local_14;
  
  randomx_vm::resetRoundingMode((randomx_vm *)0x1228f8);
  for (local_14 = 0; local_14 < 7; local_14 = local_14 + 1) {
    (*in_RDI->_vptr_randomx_vm[8])(in_RDI,in_RDI->tempHash);
    randomx_vm::getRegisterFile(in_RDI);
    randomx_blake2b(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                    in_stack_000000d0,in_stack_000000c8);
  }
  (*in_RDI->_vptr_randomx_vm[8])(in_RDI,in_RDI->tempHash);
  (*in_RDI->_vptr_randomx_vm[3])(in_RDI,in_RSI,0x20);
  return;
}

Assistant:

void randomx_calculate_hash_last(randomx_vm* machine, void* output) {
		machine->resetRoundingMode();
		for (int chain = 0; chain < RANDOMX_PROGRAM_COUNT - 1; ++chain) {
			machine->run(machine->tempHash);
			blake2b(machine->tempHash, sizeof(machine->tempHash), machine->getRegisterFile(), sizeof(randomx::RegisterFile), nullptr, 0);
		}
		machine->run(machine->tempHash);
		machine->getFinalResult(output, RANDOMX_HASH_SIZE);
	}